

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

Aig_Man_t * Iso_ManFilterPos_old(Aig_Man_t *pAig,int fVerbose)

{
  Aig_Man_t *pAVar1;
  Aig_Man_t *pAig2;
  Vec_Ptr_t *p;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vPerm1_;
  Vec_Int_t *vPerm2_;
  int *pPos;
  int local_58;
  int nPos;
  int k;
  int i;
  Aig_Man_t *pTemp;
  Aig_Man_t *pPart;
  Vec_Int_t *vMap;
  Vec_Int_t *vPos;
  Vec_Ptr_t *vAigs;
  Vec_Ptr_t *vPerms;
  Vec_Ptr_t *vParts;
  int fVeryVerbose;
  int fVerbose_local;
  Aig_Man_t *pAig_local;
  
  vParts._0_4_ = 0;
  vParts._4_4_ = fVerbose;
  _fVeryVerbose = pAig;
  iVar2 = Aig_ManCoNum(pAig);
  iVar3 = Aig_ManRegNum(_fVeryVerbose);
  iVar2 = iVar2 - iVar3;
  vPerms = Vec_PtrAlloc(iVar2);
  vAigs = Vec_PtrAlloc(iVar2);
  for (nPos = 0; nPos < iVar2; nPos = nPos + 1) {
    pTemp = Saig_ManDupCones(_fVeryVerbose,&nPos,1);
    pPart = (Aig_Man_t *)Saig_ManFindIsoPerm(pTemp,(int)vParts);
    Vec_PtrPush(vPerms,pTemp);
    Vec_PtrPush(vAigs,pPart);
  }
  vPos = (Vec_Int_t *)Vec_PtrAlloc(1000);
  vMap = Vec_IntAlloc(1000);
  nPos = 0;
  do {
    iVar3 = nPos;
    iVar2 = Vec_PtrSize(vPerms);
    if (iVar2 <= iVar3) {
      for (nPos = 0; iVar3 = nPos, iVar2 = Vec_PtrSize(vPerms), iVar3 < iVar2; nPos = nPos + 1) {
        pTemp = (Aig_Man_t *)Vec_PtrEntry(vPerms,nPos);
        Aig_ManStop(pTemp);
      }
      Vec_PtrFree(vPerms);
      for (nPos = 0; iVar3 = nPos, iVar2 = Vec_PtrSize(vAigs), iVar3 < iVar2; nPos = nPos + 1) {
        pPart = (Aig_Man_t *)Vec_PtrEntry(vAigs,nPos);
        Vec_IntFree((Vec_Int_t *)pPart);
      }
      Vec_PtrFree(vAigs);
      pAVar1 = _fVeryVerbose;
      pPos = Vec_IntArray(vMap);
      iVar3 = Vec_IntSize(vMap);
      pTemp = Saig_ManDupCones(pAVar1,pPos,iVar3);
      Vec_PtrFree((Vec_Ptr_t *)vPos);
      Vec_IntFree(vMap);
      return pTemp;
    }
    pTemp = (Aig_Man_t *)Vec_PtrEntry(vPerms,nPos);
    if ((int)vParts != 0) {
      printf("AIG %4d : ",(ulong)(uint)nPos);
      Aig_ManPrintStats(pTemp);
    }
    for (local_58 = 0; iVar3 = Vec_PtrSize((Vec_Ptr_t *)vPos), local_58 < iVar3;
        local_58 = local_58 + 1) {
      _k = (Aig_Man_t *)Vec_PtrEntry((Vec_Ptr_t *)vPos,local_58);
      if ((int)vParts != 0) {
        uVar4 = Vec_IntEntry(vMap,local_58);
        printf("Comparing AIG %4d and AIG %4d.  ",(ulong)uVar4,(ulong)(uint)nPos);
      }
      p = vAigs;
      pAig2 = pTemp;
      pAVar1 = _k;
      iVar3 = Vec_IntEntry(vMap,local_58);
      vPerm1_ = (Vec_Int_t *)Vec_PtrEntry(p,iVar3);
      vPerm2_ = (Vec_Int_t *)Vec_PtrEntry(vAigs,nPos);
      pPart = (Aig_Man_t *)Iso_ManFindMapping(pAVar1,pAig2,vPerm1_,vPerm2_,(int)vParts);
      if (pPart != (Aig_Man_t *)0x0) {
        if ((int)vParts != 0) {
          printf("Found match\n");
        }
        Vec_IntFree((Vec_Int_t *)pPart);
        break;
      }
      if ((int)vParts != 0) {
        printf("No match.\n");
      }
    }
    iVar3 = Vec_PtrSize((Vec_Ptr_t *)vPos);
    if (local_58 == iVar3) {
      Vec_PtrPush((Vec_Ptr_t *)vPos,pTemp);
      Vec_IntPush(vMap,nPos);
    }
    nPos = nPos + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Iso_ManFilterPos_old( Aig_Man_t * pAig, int fVerbose )
{
    int fVeryVerbose = 0;
    Vec_Ptr_t * vParts, * vPerms, * vAigs;
    Vec_Int_t * vPos, * vMap;
    Aig_Man_t * pPart, * pTemp;
    int i, k, nPos;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vParts = Vec_PtrAlloc( nPos );
    vPerms = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        vMap  = Saig_ManFindIsoPerm( pPart, fVeryVerbose );
        Vec_PtrPush( vParts, pPart ); 
        Vec_PtrPush( vPerms, vMap );
    }
//    s_Counter = 0;

    // check AIGs for each PO
    vAigs = Vec_PtrAlloc( 1000 );
    vPos  = Vec_IntAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
    {
        if ( fVeryVerbose )
        {
            printf( "AIG %4d : ", i );
            Aig_ManPrintStats( pPart );
        }
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, k )
        {
            if ( fVeryVerbose )
                printf( "Comparing AIG %4d and AIG %4d.  ", Vec_IntEntry(vPos,k), i );
            vMap = Iso_ManFindMapping( pTemp, pPart, 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, Vec_IntEntry(vPos,k)), 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, i),
                fVeryVerbose );
            if ( vMap != NULL )
            {
                if ( fVeryVerbose )
                    printf( "Found match\n" );
//                if ( fVerbose )
//                    printf( "Found match for AIG %4d and AIG %4d.\n", Vec_IntEntry(vPos,k), i );
                Vec_IntFree( vMap );
                break;
            }
            if ( fVeryVerbose )
                printf( "No match.\n" );
        }
        if ( k == Vec_PtrSize(vAigs) )
        {
            Vec_PtrPush( vAigs, pPart );
            Vec_IntPush( vPos, i );
        }
    }
    // delete AIGs
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
        Aig_ManStop( pPart );
    Vec_PtrFree( vParts );
    Vec_PtrForEachEntry( Vec_Int_t *, vPerms, vMap, i )
        Vec_IntFree( vMap );
    Vec_PtrFree( vPerms );
    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vPos), Vec_IntSize(vPos) );
    Vec_PtrFree( vAigs );
    Vec_IntFree( vPos );

//    printf( "The number of all checks %d.  Complex checks %d.\n", nPos*(nPos-1)/2, s_Counter );
    return pPart;
}